

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

bool __thiscall testing::TestResult::Skipped(TestResult *this)

{
  bool bVar1;
  uint uVar2;
  pointer pTVar3;
  
  bVar1 = Failed(this);
  uVar2 = 0;
  if (!bVar1) {
    for (pTVar3 = (this->test_part_results_).
                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pTVar3 != (this->test_part_results_).
                  super__Vector_base<testing::TestPartResult,_std::allocator<testing::TestPartResult>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pTVar3 = pTVar3 + 1) {
      uVar2 = uVar2 + (pTVar3->type_ == kSkip);
    }
    uVar2 = (uint)(uVar2 != 0);
  }
  return SUB41(uVar2,0);
}

Assistant:

bool TestResult::Skipped() const {
  return !Failed() && CountIf(test_part_results_, TestPartSkipped) > 0;
}